

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_sector.cpp
# Opt level: O0

int ON_SubDSectorType::Compare(ON_SubDSectorType *a,ON_SubDSectorType *b)

{
  int local_24;
  int rc;
  ON_SubDSectorType *b_local;
  ON_SubDSectorType *a_local;
  
  if (a == b) {
    a_local._4_4_ = 0;
  }
  else if (a == (ON_SubDSectorType *)0x0) {
    a_local._4_4_ = -1;
  }
  else if (b == (ON_SubDSectorType *)0x0) {
    a_local._4_4_ = 1;
  }
  else {
    local_24 = CompareUnsigned((uint)a->m_vertex_tag,(uint)b->m_vertex_tag);
    if (local_24 == 0) {
      local_24 = CompareUnsigned(a->m_sector_face_count,b->m_sector_face_count);
      if (local_24 == 0) {
        if ((a->m_vertex_tag != Corner) ||
           (local_24 = CompareUnsigned(a->m_corner_sector_angle_index,b->m_corner_sector_angle_index
                                      ), local_24 == 0)) {
          return 0;
        }
      }
      else if (b->m_sector_face_count == 0) {
        local_24 = -1;
      }
      else if (a->m_sector_face_count == 0) {
        local_24 = 1;
      }
    }
    else if (b->m_vertex_tag == Unset) {
      local_24 = -1;
    }
    else if (a->m_vertex_tag == Unset) {
      local_24 = 1;
    }
    a_local._4_4_ = local_24;
  }
  return a_local._4_4_;
}

Assistant:

int ON_SubDSectorType::Compare(const ON_SubDSectorType* a, const ON_SubDSectorType* b)
{
  if ( a == b )
    return 0;
  if (nullptr == a)
    return -1;
  if (nullptr == b)
    return 1;
  
  int rc = 0;
  for (;;)
  {
    rc = CompareUnsigned((unsigned int)a->m_vertex_tag,(unsigned int)b->m_vertex_tag);
    if (0 != rc)
    {
      // bias towards valid tags
      if ( ON_SubDVertexTag::Unset == b->m_vertex_tag)
        rc = -1;
      else if ( ON_SubDVertexTag::Unset == a->m_vertex_tag)
        rc = 1;
      break;
    }
    rc = CompareUnsigned(a->m_sector_face_count,b->m_sector_face_count);
    if (0 != rc)
    {
      // bias towards valid m_sector_face_count bug small
      if ( 0 == b->m_sector_face_count)
        rc = -1;
      else if ( 0 == a->m_sector_face_count)
        rc = 1;
      break;
    }
    if (ON_SubDVertexTag::Corner == a->m_vertex_tag)
    {
      rc = CompareUnsigned(a->m_corner_sector_angle_index, b->m_corner_sector_angle_index);
      if (0 != rc)
        break;
    }

    return 0; // equal
  }

  return rc; // not equal
}